

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O1

bool __thiscall
sentencepiece::filesystem::PosixReadableFile::ReadAll(PosixReadableFile *this,string *line)

{
  istream *piVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 in_R9;
  ulong local_20;
  undefined4 uStack_18;
  
  piVar1 = this->is_;
  if (piVar1 == (istream *)&std::cin) {
    iVar3 = logging::GetMinLogLevel();
    if (iVar3 < 3) {
      local_20 = local_20 & 0xffffffffffffff00;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"filesystem.cc",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,0x39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"LOG(",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ERROR",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"ReadAll is not supported for stdin.",0x23);
      error::Die::~Die((Die *)&local_20);
    }
  }
  else {
    pcVar2 = (line->_M_dataplus)._M_p;
    local_20 = 0;
    uStack_18 = 0xffffffff;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)line,pcVar2,pcVar2 + line->_M_string_length,
               *(undefined8 *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0xe8),0xffffffff,in_R9,
               0,0xffffffff);
  }
  return piVar1 != (istream *)&std::cin;
}

Assistant:

bool ReadAll(std::string *line) {
    if (is_ == &std::cin) {
      LOG(ERROR) << "ReadAll is not supported for stdin.";
      return false;
    }
    line->assign(std::istreambuf_iterator<char>(*is_),
                 std::istreambuf_iterator<char>());
    return true;
  }